

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O0

void __thiscall
iutest::iu_global_format_stringstream::iu_global_format_stringstream
          (iu_global_format_stringstream *this,string *str)

{
  string *str_local;
  iu_global_format_stringstream *this_local;
  
  std::ios::ios((ios *)&(this->super_iu_stringstream).field_0x80);
  std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)this,(string *)&PTR_construction_vtable_24__00160478,(_Ios_Openmode)str
            );
  *(undefined8 *)&this->super_iu_stringstream = 0x160410;
  *(undefined8 *)&(this->super_iu_stringstream).field_0x80 = 0x160460;
  *(undefined8 *)&(this->super_iu_stringstream).field_0x10 = 0x160438;
  TestEnv::global_ostream_copyfmt((iu_ostream *)&(this->super_iu_stringstream).field_0x10);
  return;
}

Assistant:

explicit iu_global_format_stringstream(const ::std::string& str)
        : iu_stringstream(str)
    {
#if IUTEST_HAS_STRINGSTREAM || IUTEST_HAS_STRSTREAM
        TestEnv::global_ostream_copyfmt(*this);
#endif
    }